

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueRelations.h
# Opt level: O2

void __thiscall
dg::vr::ValueRelations::set<dg::vr::Bucket,llvm::Value_const*>
          (ValueRelations *this,Bucket *lt,Relations rels,Value **rt)

{
  Type TVar1;
  Relations *pRVar2;
  ulong *puVar3;
  ulong uVar4;
  Relations other;
  _Base_bitset<1UL> local_38;
  Relations rels_local;
  
  rels_local = rels;
  TVar1 = dg::vr::Relations::get();
  set<dg::vr::Bucket,llvm::Value_const*>(this,lt,TVar1,rt);
  local_38._M_w = 0;
  pRVar2 = Relations::ult((Relations *)&local_38);
  pRVar2 = Relations::ule(pRVar2);
  pRVar2 = Relations::ugt(pRVar2);
  pRVar2 = Relations::uge(pRVar2);
  if (((uint)rels_local.bits.super__Base_bitset<1UL>._M_w &
       (uint)(pRVar2->bits).super__Base_bitset<1UL>._M_w & 0xfff) != 0) {
    local_38._M_w = 0;
    std::bitset<12UL>::set((bitset<12UL> *)&local_38,(ulong)TVar1,true);
    puVar3 = (ulong *)dg::vr::Relations::addImplied();
    uVar4 = dg::vr::Relations::get();
    if ((*puVar3 >> (uVar4 & 0x3f) & 1) == 0) {
      TVar1 = dg::vr::Relations::get();
      set<dg::vr::Bucket,llvm::Value_const*>(this,lt,TVar1,rt);
    }
  }
  return;
}

Assistant:

void set(const X &lt, Relations rels, const Y &rt) {
        Relations::Type rel = rels.get();
        set(lt, rel, rt);
        Relations other = rels & Relations().ult().ule().ugt().uge();
        if (other.any() && !Relations().set(rel).addImplied().has(other.get()))
            set(lt, other.get(), rt);
    }